

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O3

result_type __thiscall
math::wide_integer::uniform_int_distribution<64u,unsigned_int,void,false>::
generate<std::linear_congruential_engine<unsigned_int,48271u,0u,2147483647u>,32>
          (uniform_int_distribution<64u,unsigned_int,void,false> *this,
          linear_congruential_engine<unsigned_int,_48271U,_0U,_2147483647U> *input_generator,
          param_type *input_params)

{
  uint *puVar1;
  int *piVar2;
  int *piVar3;
  undefined8 uVar4;
  byte bVar5;
  unsigned_fast_type i;
  long lVar6;
  byte bVar7;
  sbyte sVar8;
  undefined8 uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  bool bVar14;
  result_type range;
  result_type result;
  value_type_conflict local_40 [2];
  undefined8 local_38;
  undefined8 local_30;
  array<unsigned_int,_2UL> local_28;
  int local_20 [2];
  
  local_28.elems[0] = 0;
  local_28.elems[1] = 0;
  uVar11 = input_generator->_M_x;
  uVar12 = 0;
  bVar5 = 1;
  lVar6 = 0;
  do {
    bVar7 = bVar5 - 1 & 3;
    if (bVar7 == 0) {
      uVar13 = (uVar11 % 0xadc8) * 0xbc8f;
      uVar12 = (uVar11 / 0xadc8) * 0xd47;
      uVar11 = (uVar11 / 0xadc8) * -0xd47;
      if (uVar13 < uVar12) {
        uVar11 = uVar12 ^ 0x7fffffff;
      }
      uVar11 = uVar11 + uVar13;
      input_generator->_M_x = uVar11;
      uVar12 = uVar11;
    }
    sVar8 = bVar7 << 3;
    puVar1 = (uint *)((long)local_28.elems + lVar6);
    *puVar1 = *puVar1 | (uVar12 >> sVar8 & 0xff) << sVar8;
    lVar6 = lVar6 + (ulong)((bVar5 & 3) == 0) * 4;
    bVar5 = bVar5 + 1;
  } while (lVar6 != 8);
  uVar4 = *(undefined8 *)input_params;
  local_40[0] = (int)uVar4;
  local_40[1] = (int)((ulong)uVar4 >> 0x20);
  local_38 = 0;
  lVar6 = 4;
  do {
    if (lVar6 == -4) {
      uVar9 = *(undefined8 *)
               (input_params[1].param_a.values.super_array<unsigned_char,_3UL>.elems + 2);
      local_30 = uVar9;
      local_20[0] = -1;
      local_20[1] = -1;
      lVar6 = 4;
      goto LAB_00148a8b;
    }
    piVar2 = (int *)((long)local_40 + lVar6);
    piVar3 = (int *)((long)&local_38 + lVar6);
    lVar6 = lVar6 + -4;
  } while (*piVar2 == *piVar3);
  uVar9 = *(undefined8 *)(input_params[1].param_a.values.super_array<unsigned_char,_3UL>.elems + 2);
  goto LAB_00148aa6;
  while (piVar2 = (int *)((long)&local_30 + lVar6), piVar3 = (int *)((long)local_20 + lVar6),
        lVar6 = lVar6 + -4, *piVar2 == *piVar3) {
LAB_00148a8b:
    if (lVar6 == -4) goto LAB_00148b35;
  }
LAB_00148aa6:
  local_30 = uVar4;
  local_40[0] = (int)uVar9;
  local_40[1] = (int)((ulong)uVar9 >> 0x20);
  lVar6 = 0;
  bVar14 = false;
  do {
    uVar10 = ((ulong)local_40[lVar6] - (ulong)bVar14) -
             (ulong)*(uint *)((long)&local_30 + lVar6 * 4);
    local_40[lVar6] = (value_type_conflict)uVar10;
    bVar14 = uVar10 >> 0x20 != 0;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 2);
  local_38._0_4_ = local_40[0];
  local_38._4_4_ = local_40[1];
  lVar6 = 0;
  do {
    piVar2 = (int *)((long)&local_38 + lVar6);
    *piVar2 = *piVar2 + 1;
    if (*piVar2 != 0) break;
    bVar14 = lVar6 != 4;
    lVar6 = lVar6 + 4;
  } while (bVar14);
  local_40[0] = 0;
  local_40[1] = 0;
  uintwide_t<64U,_unsigned_int,_void,_false>::eval_divide_knuth
            ((uintwide_t<64U,_unsigned_int,_void,_false> *)&local_28,
             (uintwide_t<24U,_unsigned_char,_void,_false> *)&local_38,
             (uintwide_t<24U,_unsigned_char,_void,_false> *)local_40);
  local_28.elems[0] = local_40[0];
  local_28.elems[1] = local_40[1];
  local_40 = *(value_type_conflict (*) [2])input_params;
  uintwide_t<64U,_unsigned_int,_void,_false>::operator+=
            ((uintwide_t<64U,_unsigned_int,_void,_false> *)&local_28,
             (uintwide_t<24U,_unsigned_char,_void,_false> *)local_40);
LAB_00148b35:
  return (result_type)local_28.elems[0]._0_3_;
}

Assistant:

constexpr auto generate(GeneratorType& input_generator,
                            const param_type& input_params) const -> result_type
    {
      // Generate random numbers r, where a <= r <= b.

      auto result = static_cast<result_type>(static_cast<std::uint8_t>(UINT8_C(0)));

      using local_limb_type = typename result_type::limb_type;

      using generator_result_type = typename GeneratorType::result_type;

      constexpr auto digits_generator_result_type = static_cast<std::uint32_t>(GeneratorResultBits);

      static_assert(static_cast<std::uint32_t>(digits_generator_result_type % static_cast<std::uint32_t>(UINT8_C(8))) == static_cast<std::uint32_t>(UINT8_C(0)),
                    "Error: Generator result type must have a multiple of 8 bits.");

      constexpr auto digits_limb_ratio =
        static_cast<std::uint32_t>(std::numeric_limits<local_limb_type>::digits / static_cast<int>(INT8_C(8)));

      constexpr auto digits_gtor_ratio = static_cast<std::uint32_t>(digits_generator_result_type / static_cast<std::uint32_t>(UINT8_C(8)));

      generator_result_type value = generator_result_type();

      auto it = result.representation().begin(); // NOLINT(llvm-qualified-auto,readability-qualified-auto,altera-id-dependent-backward-branch)

      auto j = static_cast<unsigned_fast_type>(UINT8_C(0));

      while(it != result.representation().end()) // NOLINT(altera-id-dependent-backward-branch)
      {
        if(static_cast<unsigned_fast_type>(j % static_cast<unsigned_fast_type>(digits_gtor_ratio)) == static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          value = input_generator();
        }

        const auto right_shift_amount =
          static_cast<unsigned>
          (
              static_cast<unsigned_fast_type>(j % digits_gtor_ratio)
            * static_cast<unsigned_fast_type>(UINT8_C(8))
          );

        const auto next_byte = static_cast<std::uint8_t>(value >> right_shift_amount);

        *it =
          static_cast<typename result_type::limb_type>
          (
            *it | static_cast<local_limb_type>(static_cast<local_limb_type>(next_byte) << static_cast<unsigned>(static_cast<unsigned_fast_type>(j % digits_limb_ratio) * static_cast<unsigned_fast_type>(UINT8_C(8))))
          );

        ++j;

        if(static_cast<unsigned_fast_type>(j % digits_limb_ratio) == static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          ++it;
        }
      }

      if(   (input_params.get_a() != (std::numeric_limits<result_type>::min)())
         || (input_params.get_b() != (std::numeric_limits<result_type>::max)()))
      {
        // Note that this restricts the range r to:
        //   r = { [input_generator() % ((b - a) + 1)] + a }

        result_type range(input_params.get_b() - input_params.get_a());

        ++range;

        result %= range;
        result += input_params.get_a();
      }

      return result;
    }